

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QGate2<std::complex<double>_>::apply
          (QGate2<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  reference pvVar2;
  SquareMatrix<std::complex<double>_> *mat2;
  int iVar3;
  undefined4 in_register_00000084;
  SquareMatrix<std::complex<double>_> local_158;
  undefined1 local_148 [8];
  anon_class_264_17_dd0fa161 f;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  QGate2<std::complex<double>_> *this_local;
  
  pvVar1 = (vector<int,_std::allocator<int>_> *)(f.m44._M_value + 8);
  iVar3 = offset;
  (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[5])();
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,0);
  *pvVar2 = *pvVar2 + offset;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,1);
  *pvVar2 = *pvVar2 + offset;
  (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[7])(&local_158);
  mat2 = (SquareMatrix<std::complex<double>_> *)
         std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::data(vector);
  lambda_QGate2<std::complex<double>>
            ((anon_class_264_17_dd0fa161 *)local_148,(qgates *)(ulong)(uint)(int)(char)op,
             (Op)&local_158,mat2,(complex<double> *)CONCAT44(in_register_00000084,iVar3));
  dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_158);
  pvVar1 = (vector<int,_std::allocator<int>_> *)(f.m44._M_value + 8);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,0);
  iVar3 = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,1);
  apply4<qclab::qgates::lambda_QGate2<std::complex<double>>(qclab::Op,qclab::dense::SquareMatrix<std::complex<double>>,std::complex<double>*)::_lambda(unsigned_long,unsigned_long,unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar3,*pvVar2,(anon_class_264_17_dd0fa161 *)local_148);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)(f.m44._M_value + 8));
  return;
}

Assistant:

void QGate2< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_QGate2( op , this->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , f ) ;
  }